

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::WeakFulfiller<kj::HttpClient::WebSocketResponse>::disposeImpl
          (WeakFulfiller<kj::HttpClient::WebSocketResponse> *this,void *pointer)

{
  PromiseFulfiller<kj::HttpClient::WebSocketResponse> *pPVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  String local_198;
  Exception local_178;
  
  if (this->inner != (PromiseFulfiller<kj::HttpClient::WebSocketResponse> *)0x0) {
    iVar4 = (*this->inner->_vptr_PromiseFulfiller[2])();
    if ((char)iVar4 != '\0') {
      pPVar1 = this->inner;
      heapString(&local_198,"PromiseFulfiller was destroyed without fulfilling the promise.",0x3e);
      Exception::Exception
                (&local_178,FAILED,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/../kj/async-inl.h"
                 ,0x430,&local_198);
      (*pPVar1->_vptr_PromiseFulfiller[1])(pPVar1,&local_178);
      Exception::~Exception(&local_178);
      sVar3 = local_198.content.size_;
      pcVar2 = local_198.content.ptr;
      if (local_198.content.ptr != (char *)0x0) {
        local_198.content.ptr = (char *)0x0;
        local_198.content.size_ = 0;
        (**(local_198.content.disposer)->_vptr_ArrayDisposer)
                  (local_198.content.disposer,pcVar2,1,sVar3,sVar3,0);
      }
    }
    this->inner = (PromiseFulfiller<kj::HttpClient::WebSocketResponse> *)0x0;
    return;
  }
  operator_delete(this,0x18);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override {
    // TODO(perf): Factor some of this out so it isn't regenerated for every fulfiller type?

    if (inner == nullptr) {
      // Already detached.
      delete this;
    } else {
      if (inner->isWaiting()) {
        inner->reject(kj::Exception(kj::Exception::Type::FAILED, __FILE__, __LINE__,
            kj::heapString("PromiseFulfiller was destroyed without fulfilling the promise.")));
      }
      inner = nullptr;
    }
  }